

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O2

int CfdAddPsbtGlobalXpubkey
              (void *handle,void *psbt_handle,char *xpubkey,char *fingerprint,char *bip32_path)

{
  bool bVar1;
  NetType NVar2;
  size_t sVar3;
  CfdException *pCVar4;
  allocator local_3ba;
  allocator local_3b9;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_3b8;
  string local_3a0;
  string local_380;
  string xpub_str;
  ExtPubkey local_340;
  KeyData local_2d0;
  KeyData key_data;
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)&key_data,"PsbtHandle",(allocator *)&local_2d0);
  cfd::capi::CheckBuffer(psbt_handle,(string *)&key_data);
  std::__cxx11::string::~string((string *)&key_data);
  bVar1 = cfd::capi::IsEmptyString(xpubkey);
  if (bVar1) {
    key_data.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = "cfdcapi_psbt.cpp";
    key_data.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x83c;
    key_data.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = "CfdAddPsbtGlobalXpubkey";
    cfd::core::logger::warn<>((CfdSourceLocation *)&key_data,"xpubkey is null or empty.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&key_data,"Failed to parameter. xpubkey is null or empty.",
               (allocator *)&local_2d0);
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&key_data);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(long *)((long)psbt_handle + 0x18) == 0) {
    key_data.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = "cfdcapi_psbt.cpp";
    key_data.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x842;
    key_data.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = "CfdAddPsbtGlobalXpubkey";
    cfd::core::logger::warn<>((CfdSourceLocation *)&key_data,"psbt is null.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&key_data,"Failed to handle statement. psbt is null.",
               (allocator *)&local_2d0);
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)&key_data);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::__cxx11::string::string((string *)&xpub_str,xpubkey,(allocator *)&key_data);
  cfd::core::KeyData::KeyData(&key_data);
  if (xpub_str._M_string_length == 0x9c) {
    cfd::core::ByteData::ByteData((ByteData *)&local_3a0,&xpub_str);
    cfd::core::ExtPubkey::ExtPubkey(&local_340,(ByteData *)&local_3a0);
    std::__cxx11::string::string((string *)&local_380,"",&local_3ba);
    cfd::core::ByteData::ByteData((ByteData *)&local_3b8);
    cfd::core::KeyData::KeyData(&local_2d0,&local_340,&local_380,(ByteData *)&local_3b8);
    cfd::core::KeyData::operator=(&key_data,&local_2d0);
    cfd::core::KeyData::~KeyData(&local_2d0);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_3b8);
    std::__cxx11::string::~string((string *)&local_380);
    cfd::core::ExtPubkey::~ExtPubkey(&local_340);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_3a0);
  }
  else {
    cfd::core::KeyData::KeyData(&local_2d0,&xpub_str,-1,false);
    cfd::core::KeyData::operator=(&key_data,&local_2d0);
    cfd::core::KeyData::~KeyData(&local_2d0);
    bVar1 = cfd::core::KeyData::HasExtPubkey(&key_data);
    if ((!bVar1) || (bVar1 = cfd::core::KeyData::HasExtPrivkey(&key_data), bVar1)) {
      local_2d0.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = "cfdcapi_psbt.cpp";
      local_2d0.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 0x84f;
      local_2d0.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = "CfdAddPsbtGlobalXpubkey";
      cfd::core::logger::warn<>((CfdSourceLocation *)&local_2d0,"psbt invalid xpubkey format.");
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_2d0,"Failed to parameter. psbt invalid xpubkey format.",
                 (allocator *)&local_340);
      cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_2d0);
      __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
  }
  cfd::core::KeyData::GetExtPubkey((ExtPubkey *)&local_2d0,&key_data);
  NVar2 = cfd::core::ExtPubkey::GetNetworkType((ExtPubkey *)&local_2d0);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)&local_2d0);
  if ((*(int *)((long)psbt_handle + 0x10) != 0) == (NVar2 == kMainnet)) {
    local_2d0.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = "cfdcapi_psbt.cpp";
    local_2d0.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x85a;
    local_2d0.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = "CfdAddPsbtGlobalXpubkey";
    cfd::core::logger::warn<>((CfdSourceLocation *)&local_2d0,"unmatch xpubkey network type.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&local_2d0,"Failed to parameter. unmatch xpubkey network type.",
               (allocator *)&local_340);
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_2d0);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::core::KeyData::GetBip32Path_abi_cxx11_((string *)&local_2d0,&key_data,kApostrophe,false);
  if (CONCAT44(local_2d0.pubkey_.data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish._4_4_,
               local_2d0.pubkey_.data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish._0_4_) == 0) {
    std::__cxx11::string::~string((string *)&local_2d0);
  }
  else {
    cfd::core::KeyData::GetFingerprint(&local_340.serialize_data_,&key_data);
    sVar3 = cfd::core::ByteData::GetDataSize(&local_340.serialize_data_);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_340);
    std::__cxx11::string::~string((string *)&local_2d0);
    if (sVar3 == 4) goto LAB_0038cb51;
  }
  bVar1 = cfd::capi::IsEmptyString(fingerprint);
  if (bVar1) {
    local_2d0.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = "cfdcapi_psbt.cpp";
    local_2d0.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x863;
    local_2d0.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = "CfdAddPsbtGlobalXpubkey";
    cfd::core::logger::warn<>((CfdSourceLocation *)&local_2d0,"fingerprint is null or empty.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&local_2d0,"Failed to parameter. fingerprint is null or empty.",
               (allocator *)&local_340);
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_2d0);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(bip32_path);
  if (bVar1) {
    local_2d0.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = "cfdcapi_psbt.cpp";
    local_2d0.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x869;
    local_2d0.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = "CfdAddPsbtGlobalXpubkey";
    cfd::core::logger::warn<>((CfdSourceLocation *)&local_2d0,"bip32_path is null or empty.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&local_2d0,"Failed to parameter. bip32_path is null or empty.",
               (allocator *)&local_340);
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_2d0);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::core::KeyData::GetExtPubkey(&local_340,&key_data);
  std::__cxx11::string::string((string *)&local_380,bip32_path,&local_3ba);
  std::__cxx11::string::string((string *)&local_3a0,fingerprint,&local_3b9);
  cfd::core::ByteData::ByteData((ByteData *)&local_3b8,&local_3a0);
  cfd::core::KeyData::KeyData(&local_2d0,&local_340,&local_380,(ByteData *)&local_3b8);
  cfd::core::KeyData::operator=(&key_data,&local_2d0);
  cfd::core::KeyData::~KeyData(&local_2d0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_3b8);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_380);
  cfd::core::ExtPubkey::~ExtPubkey(&local_340);
LAB_0038cb51:
  cfd::core::Psbt::SetGlobalXpubkey(*(Psbt **)((long)psbt_handle + 0x18),&key_data);
  cfd::core::KeyData::~KeyData(&key_data);
  std::__cxx11::string::~string((string *)&xpub_str);
  return 0;
}

Assistant:

int CfdAddPsbtGlobalXpubkey(
    void* handle, void* psbt_handle, const char* xpubkey,
    const char* fingerprint, const char* bip32_path) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (IsEmptyString(xpubkey)) {
      warn(CFD_LOG_SOURCE, "xpubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. xpubkey is null or empty.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    std::string xpub_str(xpubkey);
    KeyData key_data;
    if (xpub_str.length() == kCfdExtPubkeyHexSize) {
      key_data = KeyData(ExtPubkey(ByteData(xpub_str)), "", ByteData());
    } else {
      key_data = KeyData(xpub_str);
      if ((!key_data.HasExtPubkey()) || key_data.HasExtPrivkey()) {
        warn(CFD_LOG_SOURCE, "psbt invalid xpubkey format.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. psbt invalid xpubkey format.");
      }
    }

    bool has_mainnet =
        (key_data.GetExtPubkey().GetNetworkType() == NetType::kMainnet);
    if (((psbt_obj->net_type == NetType::kMainnet) && (!has_mainnet)) ||
        ((psbt_obj->net_type != NetType::kMainnet) && (has_mainnet))) {
      warn(CFD_LOG_SOURCE, "unmatch xpubkey network type.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. unmatch xpubkey network type.");
    }

    if (key_data.GetBip32Path().empty() ||
        (key_data.GetFingerprint().GetDataSize() != 4)) {
      if (IsEmptyString(fingerprint)) {
        warn(CFD_LOG_SOURCE, "fingerprint is null or empty.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. fingerprint is null or empty.");
      }
      if (IsEmptyString(bip32_path)) {
        warn(CFD_LOG_SOURCE, "bip32_path is null or empty.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. bip32_path is null or empty.");
      }
      key_data = KeyData(
          key_data.GetExtPubkey(), std::string(bip32_path),
          ByteData(fingerprint));
    }
    psbt_obj->psbt->SetGlobalXpubkey(key_data);
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}